

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

void flatcc_emitter_clear(flatcc_emitter_t *E)

{
  flatcc_emitter_page_t *pfVar1;
  flatcc_emitter_page_t *__ptr;
  
  __ptr = E->front;
  if (__ptr != (flatcc_emitter_page_t *)0x0) {
    __ptr->prev->next = (flatcc_emitter_page_t *)0x0;
    while (pfVar1 = __ptr->next, pfVar1 != (flatcc_emitter_page_t *)0x0) {
      free(pfVar1->prev);
      __ptr = pfVar1;
    }
    free(__ptr);
    E->used = 0;
    E->capacity = 0;
    E->back_cursor = (uint8_t *)0x0;
    E->back_left = 0;
    E->front_cursor = (uint8_t *)0x0;
    E->front_left = 0;
    E->front = (flatcc_emitter_page_t *)0x0;
    E->back = (flatcc_emitter_page_t *)0x0;
    E->used_average = 0;
  }
  return;
}

Assistant:

void flatcc_emitter_clear(flatcc_emitter_t *E)
{
    flatcc_emitter_page_t *p = E->front;

    if (!p) {
        return;
    }
    p->prev->next = 0;
    while (p->next) {
        p = p->next;
        FLATCC_EMITTER_FREE(p->prev);
    }
    FLATCC_EMITTER_FREE(p);
    memset(E, 0, sizeof(*E));
}